

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall
Minisat::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Minisat::Lit,_int> *out_clause)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  anon_struct_4_5_613047fb_for_header *paVar2;
  long lVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  bool bVar7;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  bVar7 = (uint)_ps->header >> 5 < (uint)_qs->header >> 5;
  aVar1 = _qs->header;
  paVar2 = &_ps->header;
  if (bVar7) {
    aVar1 = _ps->header;
    paVar2 = &_qs->header;
  }
  uVar4 = (ulong)(uint)aVar1;
  if (bVar7) {
    _qs = _ps;
  }
  local_38 = in_RAX;
  for (uVar6 = 0; uVar6 < uVar4 >> 5; uVar6 = uVar6 + 1) {
    aVar1 = (&_qs->header)[uVar6 + 1];
    if ((int)aVar1 >> 1 != v) {
      uVar5 = 0;
      do {
        if ((uint)*paVar2 >> 5 == uVar5) {
          local_38 = CONCAT44(aVar1,local_38._0_4_);
          vec<Minisat::Lit,_int>::push(out_clause,(Lit *)((long)&local_38 + 4));
          uVar4 = (ulong)(uint)_qs->header;
          goto LAB_00111418;
        }
        lVar3 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while ((int)paVar2[lVar3] >> 1 != (int)aVar1 >> 1);
      if (((uint)paVar2[lVar3] ^ (uint)aVar1) == 1) goto LAB_0011144c;
    }
LAB_00111418:
  }
  for (uVar5 = 0; uVar5 < (uint)*paVar2 >> 5; uVar5 = uVar5 + 1) {
    if ((int)paVar2[uVar5 + 1] >> 1 != v) {
      local_38 = CONCAT44(local_38._4_4_,paVar2[uVar5 + 1]);
      vec<Minisat::Lit,_int>::push(out_clause,(Lit *)&local_38);
    }
  }
LAB_0011144c:
  return uVar4 >> 5 <= uVar6;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    for (int i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])){
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (int i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}